

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Bech32.cpp
# Opt level: O0

void __thiscall
Bech32Test_reject_data_out_of_range_Test::~Bech32Test_reject_data_out_of_range_Test
          (Bech32Test_reject_data_out_of_range_Test *this)

{
  Bech32Test_reject_data_out_of_range_Test *this_local;
  
  ~Bech32Test_reject_data_out_of_range_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Bech32Test, reject_data_out_of_range) {
    std::string data(" ");
    EXPECT_THROW(rejectBStringValuesOutOfRange(data), std::runtime_error);

    data = "\x20";
    EXPECT_THROW(rejectBStringValuesOutOfRange(data), std::runtime_error);

    data = "\x7f";
    EXPECT_THROW(rejectBStringValuesOutOfRange(data), std::runtime_error);

    data = " abc\x7fxyz\x0d";
    EXPECT_THROW(rejectBStringValuesOutOfRange(data), std::runtime_error);
}